

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cURLpp.cpp
# Opt level: O3

string * curlpp::unescape(string *__return_storage_ptr__,string *url)

{
  char *pcVar1;
  char *__s;
  RuntimeError *this;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __s = (char *)curl_unescape((url->_M_dataplus)._M_p);
  if (__s != (char *)0x0) {
    pcVar1 = (char *)__return_storage_ptr__->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar1,(ulong)__s);
    curl_free(__s);
    return __return_storage_ptr__;
  }
  this = (RuntimeError *)__cxa_allocate_exception(0x10);
  RuntimeError::RuntimeError(this,"unable to escape the string");
  __cxa_throw(this,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

std::string
curlpp::unescape(const std::string & url)
{
   std::string buffer;
   char* p = curl_unescape(url.c_str(), (int)url.size());
   if (!p)
   {
      throw RuntimeError("unable to escape the string"); //we got an error
   }
   else
   {
      buffer = p;
      curl_free(p);
   }
   return buffer;
}